

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushID(int int_id)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  uint *puVar5;
  ImGuiContext *ctx;
  uint *__dest;
  int iVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  byte local_24 [4];
  
  pIVar4 = GImGui->CurrentWindow;
  iVar2 = (pIVar4->IDStack).Size;
  uVar8 = ~(pIVar4->IDStack).Data[(long)iVar2 + -1];
  lVar7 = 0;
  do {
    uVar8 = uVar8 >> 8 ^ GCrc32LookupTable[(uint)local_24[lVar7] ^ uVar8 & 0xff];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  iVar3 = (pIVar4->IDStack).Capacity;
  if (iVar2 == iVar3) {
    if (iVar3 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar3 / 2 + iVar3;
    }
    iVar9 = iVar2 + 1;
    if (iVar2 + 1 < iVar6) {
      iVar9 = iVar6;
    }
    if (iVar3 < iVar9) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (uint *)(*GImAllocatorAllocFunc)((long)iVar9 << 2,GImAllocatorUserData);
      puVar5 = (pIVar4->IDStack).Data;
      if (puVar5 != (uint *)0x0) {
        memcpy(__dest,puVar5,(long)(pIVar4->IDStack).Size << 2);
        puVar5 = (pIVar4->IDStack).Data;
        if ((puVar5 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar5,GImAllocatorUserData);
      }
      (pIVar4->IDStack).Data = __dest;
      (pIVar4->IDStack).Capacity = iVar9;
    }
  }
  (pIVar4->IDStack).Data[(pIVar4->IDStack).Size] = ~uVar8;
  (pIVar4->IDStack).Size = (pIVar4->IDStack).Size + 1;
  return;
}

Assistant:

void ImGui::PushID(int int_id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiID id = window->GetIDNoKeepAlive(int_id);
    window->IDStack.push_back(id);
}